

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void lyd_free_attr(ly_ctx *ctx,lyd_node *parent,lyd_attr *attr,int recursive)

{
  lyd_attr *plVar1;
  lyd_attr *plVar2;
  undefined8 *puVar3;
  lyd_attr **pplVar4;
  
  if (attr == (lyd_attr *)0x0 || ctx == (ly_ctx *)0x0) {
    return;
  }
  if (parent == (lyd_node *)0x0) {
    if (recursive != 0) goto LAB_001668ad;
LAB_001668a1:
    pplVar4 = &attr->next;
  }
  else {
    plVar1 = parent->attr;
    if (parent->attr == attr) {
      pplVar4 = &parent->attr;
    }
    else {
      do {
        plVar2 = plVar1;
        plVar1 = plVar2->next;
      } while (plVar1 != attr);
      pplVar4 = &plVar2->next;
    }
    if (recursive == 0) {
      *pplVar4 = attr->next;
      goto LAB_001668a1;
    }
  }
  *pplVar4 = (lyd_attr *)0x0;
LAB_001668ad:
  while( true ) {
    if (attr == (lyd_attr *)0x0) {
      return;
    }
    plVar1 = attr->next;
    lydict_remove(ctx,attr->name);
    puVar3 = (undefined8 *)
             lys_ext_complex_get_substmt(LY_STMT_TYPE,attr->annotation,(lyext_substmt **)0x0);
    if (puVar3 == (undefined8 *)0x0) break;
    lyd_free_value(attr->value,attr->value_type,attr->value_flags,(lys_type *)*puVar3,
                   attr->value_str,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
    lydict_remove(ctx,attr->value_str);
    free(attr);
    attr = plVar1;
  }
  __assert_fail("type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                ,0x176b,
                "void lyd_free_attr(struct ly_ctx *, struct lyd_node *, struct lyd_attr *, int)");
}

Assistant:

API void
lyd_free_attr(struct ly_ctx *ctx, struct lyd_node *parent, struct lyd_attr *attr, int recursive)
{
    struct lyd_attr *iter;
    struct lys_type **type;

    if (!ctx || !attr) {
        return;
    }

    if (parent) {
        if (parent->attr == attr) {
            if (recursive) {
                parent->attr = NULL;
            } else {
                parent->attr = attr->next;
            }
        } else {
            for (iter = parent->attr; iter->next != attr; iter = iter->next);
            if (iter->next) {
                if (recursive) {
                    iter->next = NULL;
                } else {
                    iter->next = attr->next;
                }
            }
        }
    }

    if (!recursive) {
        attr->next = NULL;
    }

    for(iter = attr; iter; ) {
        attr = iter;
        iter = iter->next;

        lydict_remove(ctx, attr->name);
        type = lys_ext_complex_get_substmt(LY_STMT_TYPE, attr->annotation, NULL);
        assert(type);
        lyd_free_value(attr->value, attr->value_type, attr->value_flags, *type, attr->value_str, NULL, NULL, NULL);
        lydict_remove(ctx, attr->value_str);
        free(attr);
    }
}